

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O2

uint64_t serfloat_tests::anon_unknown_4::TestDouble(double f)

{
  uint64_t v;
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  double *pdVar3;
  long in_FS_OFFSET;
  double f_00;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar4;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  lazy_ostream local_a8;
  undefined1 *local_98;
  char **local_90;
  uint64_t i2;
  element_type *local_80;
  shared_count sStack_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  double f2;
  uint64_t i;
  double f_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  f_local = f;
  v = EncodeDouble(f);
  i = v;
  f_00 = DecodeDouble(v);
  f2 = f_00;
  if (NAN(f)) {
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_58 = "";
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_68 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = &DAT_0000001a;
    file_02.m_begin = (iterator)&local_60;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_70,
               msg_02);
    i2 = CONCAT71(i2._1_7_,NAN(f_00));
    local_80 = (element_type *)0x0;
    sStack_78.pi_ = (sp_counted_base *)0x0;
    local_90 = &local_b8;
    local_b8 = "std::isnan(f2)";
    local_b0 = "";
    local_a8.m_empty = false;
    local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_c0 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&i2,&local_a8,1,0,WARN,_cVar4,(size_t)&local_c8,0x1a);
    boost::detail::shared_count::~shared_count(&sStack_78);
  }
  else {
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x1d;
    file.m_begin = (iterator)&local_d8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
    i2 = CONCAT71(i2._1_7_,!NAN(f_00));
    local_80 = (element_type *)0x0;
    sStack_78.pi_ = (sp_counted_base *)0x0;
    local_90 = &local_b8;
    local_b8 = "!std::isnan(f2)";
    local_b0 = "";
    local_a8.m_empty = false;
    local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_f0 = "";
    pvVar1 = &DAT_00000001;
    pvVar2 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&i2,&local_a8,1,0,WARN,_cVar4,(size_t)&local_f8,0x1d);
    boost::detail::shared_count::~shared_count(&sStack_78);
    i2 = EncodeDouble(f_00);
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x1f;
    file_00.m_begin = (iterator)&local_108;
    msg_00.m_end = pvVar2;
    msg_00.m_begin = pvVar1;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
               msg_00);
    local_a8.m_empty = false;
    local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = (char **)0xc7f1cc;
    local_128 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_120 = "";
    pvVar1 = (iterator)0x2;
    pdVar3 = &f_local;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (&local_a8,&local_128,0x1f,1,2,pdVar3,"f",&f2,"f2");
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x20;
    file_01.m_begin = (iterator)&local_138;
    msg_01.m_end = (iterator)pdVar3;
    msg_01.m_begin = pvVar1;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
               msg_01);
    local_a8.m_empty = false;
    local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = (char **)0xc7f1cc;
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serfloat_tests.cpp"
    ;
    local_150 = "";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_a8,&local_158,0x20,1,2,&i,"i",&i2,"i2");
    v = i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return v;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t TestDouble(double f) {
    uint64_t i = EncodeDouble(f);
    double f2 = DecodeDouble(i);
    if (std::isnan(f)) {
        // NaN is not guaranteed to round-trip exactly.
        BOOST_CHECK(std::isnan(f2));
    } else {
        // Everything else is.
        BOOST_CHECK(!std::isnan(f2));
        uint64_t i2 = EncodeDouble(f2);
        BOOST_CHECK_EQUAL(f, f2);
        BOOST_CHECK_EQUAL(i, i2);
    }
    return i;
}